

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O0

void DrawImageToBox(FTexture *tex,int x,int y,int w,int h,int trans)

{
  double dVar1;
  double dVar2;
  double texheight;
  double texwidth;
  double scale2;
  double scale1;
  int trans_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  FTexture *tex_local;
  
  if (tex != (FTexture *)0x0) {
    dVar1 = FTexture::GetScaledWidthDouble(tex);
    dVar2 = FTexture::GetScaledHeightDouble(tex);
    if (dVar1 <= (double)w) {
      scale2 = 1.0;
    }
    else {
      scale2 = (double)w / dVar1;
    }
    if (dVar2 <= (double)h) {
      texwidth = 1.0;
    }
    else {
      texwidth = (double)h / dVar2;
    }
    if (texwidth < scale2) {
      scale2 = texwidth;
    }
    DCanvas::DrawTexture
              ((DCanvas *)screen,tex,(double)((w >> 1) + x),(double)(h + y),0x400013a8,1,0x40001399,
               (ulong)(uint)hudwidth,0x4000139a,hudheight,0x4000138b,trans,0x40001389,
               (int)(dVar1 * scale2),0x4000138a,(int)(dVar2 * scale2),0x4000139e,1,0);
  }
  return;
}

Assistant:

static void DrawImageToBox(FTexture * tex, int x, int y, int w, int h, int trans=0xc000)
{
	double scale1, scale2;

	if (tex)
	{
		double texwidth=tex->GetScaledWidthDouble();
		double texheight=tex->GetScaledHeightDouble();

		if (w<texwidth) scale1=w/texwidth;
		else scale1=1.0f;
		if (h<texheight) scale2=h/texheight;
		else scale2=1.0f;
		if (scale2<scale1) scale1=scale2;

		x+=w>>1;
		y+=h;

		w=(int)(texwidth*scale1);
		h=(int)(texheight*scale1);

		screen->DrawTexture(tex, x, y,
			DTA_KeepRatio, true,
			DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, DTA_Alpha, trans, 
			DTA_DestWidth, w, DTA_DestHeight, h, DTA_CenterBottomOffset, 1, TAG_DONE);

	}
}